

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O2

double __thiscall ON_Line::MaximumDistanceTo(ON_Line *this,ON_Line *L)

{
  double dVar1;
  double dVar2;
  
  dVar1 = MaximumDistanceTo(this,&L->from);
  dVar2 = MaximumDistanceTo(this,&L->to);
  if (dVar2 <= dVar1) {
    dVar2 = dVar1;
  }
  return dVar2;
}

Assistant:

double ON_Line::MaximumDistanceTo( const ON_Line& L ) const
{
  double a, b;
  a = MaximumDistanceTo(L.from);
  b = MaximumDistanceTo(L.to);
  return ((a<b)?b:a);
}